

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_rangeproof_sign_impl
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,uchar *proof,size_t *plen,
              uint64_t min_value,secp256k1_ge *commit,uchar *blind,uchar *nonce,int exp,int min_bits
              ,uint64_t value,uchar *message,size_t msg_len,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_ge *genp)

{
  uchar uVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  byte local_6bf8;
  undefined1 local_6bf0 [7];
  uchar quadness;
  secp256k1_ge c;
  uchar tmpc [33];
  size_t idx;
  size_t npub;
  ulong uStack_6b58;
  int overflow;
  size_t i;
  size_t len;
  size_t secidx [32];
  size_t rsizes [32];
  size_t local_6940;
  size_t rings;
  uint64_t uStack_6930;
  int mantissa;
  uint64_t scale;
  uint64_t v;
  uchar *signs;
  uchar tmp [33];
  uchar local_68e8 [8];
  uchar prep [4096];
  undefined1 local_58e0 [8];
  secp256k1_sha256 sha256_m;
  secp256k1_scalar stmp;
  secp256k1_scalar k [32];
  secp256k1_scalar sec [32];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  uchar *blind_local;
  secp256k1_ge *commit_local;
  uint64_t min_value_local;
  size_t *plen_local;
  uchar *proof_local;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_local;
  
  i = 0;
  if (((((*plen < 0x41) || (value < min_value)) || (0x40 < min_bits)) ||
      ((min_bits < 0 || (exp < -1)))) || (0x12 < exp)) {
    ecmult_gen_ctx_local._4_4_ = 0;
  }
  else {
    commit_local = (secp256k1_ge *)min_value;
    min_value_local = (uint64_t)plen;
    plen_local = (size_t *)proof;
    proof_local = (uchar *)ecmult_gen_ctx;
    iVar4 = secp256k1_range_proveparams
                      (&scale,&local_6940,secidx + 0x1f,&idx,&len,(uint64_t *)&commit_local,
                       (int *)((long)&rings + 4),&stack0xffffffffffff96d0,&exp,&min_bits,value);
    if (iVar4 == 0) {
      ecmult_gen_ctx_local._4_4_ = 0;
    }
    else {
      if (secidx[0x1f] < 2) {
        local_6bf8 = 0;
      }
      else {
        local_6bf8 = (byte)exp | 0x40;
      }
      bVar6 = 0;
      if (commit_local != (secp256k1_ge *)0x0) {
        bVar6 = 0x20;
      }
      *(byte *)((long)plen_local + i) = local_6bf8 | bVar6;
      sVar3 = i + 1;
      if (1 < secidx[0x1f]) {
        *(char *)((long)plen_local + i + 1) = rings._4_1_ + -1;
        sVar3 = i + 2;
      }
      i = sVar3;
      if (commit_local != (secp256k1_ge *)0x0) {
        for (uStack_6b58 = 0; uStack_6b58 < 8; uStack_6b58 = uStack_6b58 + 1) {
          *(char *)((long)plen_local + i + uStack_6b58) =
               (char)((ulong)commit_local >> (('\a' - (char)uStack_6b58) * '\b' & 0x3fU));
        }
        i = i + 8;
      }
      if ((msg_len == 0) || (msg_len <= (local_6940 - 1) * 0x80)) {
        if (*(long *)min_value_local - i <
            (idx + local_6940 + -1) * 0x20 + 0x20 + (local_6940 + 6 >> 3)) {
          ecmult_gen_ctx_local._4_4_ = 0;
        }
        else {
          secp256k1_sha256_initialize((secp256k1_sha256 *)local_58e0);
          secp256k1_rangeproof_serialize_point((uchar *)&signs,commit);
          secp256k1_sha256_write((secp256k1_sha256 *)local_58e0,(uchar *)&signs,0x21);
          secp256k1_rangeproof_serialize_point((uchar *)&signs,genp);
          secp256k1_sha256_write((secp256k1_sha256 *)local_58e0,(uchar *)&signs,0x21);
          secp256k1_sha256_write((secp256k1_sha256 *)local_58e0,(uchar *)plen_local,i);
          memset(local_68e8,0,0x1000);
          if (message != (uchar *)0x0) {
            memcpy(local_68e8,message,msg_len);
          }
          if (1 < secidx[local_6940 + 0x1e]) {
            lVar5 = ((local_6940 - 1) * 4 +
                    ((secidx[local_6940 + 0x1e] - 1) -
                    (long)(int)(uint)(secidx[local_6940 - 2] == secidx[local_6940 + 0x1e] - 1))) *
                    0x20;
            for (uStack_6b58 = 0; uStack_6b58 < 8; uStack_6b58 = uStack_6b58 + 1) {
              uVar1 = (uchar)(scale >> (0x38U - (char)(uStack_6b58 << 3) & 0x3f));
              prep[uStack_6b58 + lVar5 + 0x10] = uVar1;
              prep[uStack_6b58 + lVar5 + 8] = uVar1;
              prep[uStack_6b58 + lVar5] = uVar1;
              local_68e8[uStack_6b58 + lVar5] = '\0';
            }
            local_68e8[lVar5] = 0x80;
          }
          iVar4 = secp256k1_rangeproof_genrand
                            ((secp256k1_scalar *)(k[0x1f].d + 3),
                             (secp256k1_scalar *)(sec[0x1f].d + 3),local_68e8,secidx + 0x1f,
                             local_6940,nonce,commit,(uchar *)plen_local,i,genp);
          if (iVar4 == 0) {
            ecmult_gen_ctx_local._4_4_ = 0;
          }
          else {
            memset(local_68e8,0,0x1000);
            for (uStack_6b58 = 0; uStack_6b58 < local_6940; uStack_6b58 = uStack_6b58 + 1) {
              lVar5 = uStack_6b58 * 4 + secidx[uStack_6b58 - 1];
              k[uStack_6b58 - 1].d[3] = sec[lVar5 + 0x1f].d[3];
              k[uStack_6b58].d[0] = s[lVar5].d[0];
              k[uStack_6b58].d[1] = s[lVar5].d[1];
              k[uStack_6b58].d[2] = s[lVar5].d[2];
              secp256k1_scalar_clear
                        ((secp256k1_scalar *)
                         (sec[uStack_6b58 * 4 + secidx[uStack_6b58 - 1] + 0x1f].d + 3));
            }
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)&sha256_m.bytes,blind,(int *)((long)&npub + 4));
            secp256k1_scalar_add
                      ((secp256k1_scalar *)(k[local_6940 + 0x1e].d + 3),
                       (secp256k1_scalar *)(k[local_6940 + 0x1e].d + 3),
                       (secp256k1_scalar *)&sha256_m.bytes);
            if ((npub._4_4_ == 0) &&
               (iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)(k[local_6940 + 0x1e].d + 3)),
               iVar4 == 0)) {
              v = (long)plen_local + i;
              for (uStack_6b58 = 0; uStack_6b58 < local_6940 + 6 >> 3; uStack_6b58 = uStack_6b58 + 1
                  ) {
                *(undefined1 *)(v + uStack_6b58) = 0;
                i = i + 1;
              }
              idx = 0;
              for (uStack_6b58 = 0; uStack_6b58 < local_6940; uStack_6b58 = uStack_6b58 + 1) {
                secp256k1_pedersen_ecmult
                          ((secp256k1_ecmult_gen_context *)proof_local,
                           (secp256k1_gej *)&pubs[idx - 1].infinity,
                           (secp256k1_scalar *)(k[uStack_6b58 + 0x1f].d + 3),
                           secidx[uStack_6b58 - 1] * uStack_6930 <<
                           ((byte)(uStack_6b58 << 1) & 0x3f),genp);
                iVar4 = secp256k1_gej_is_infinity((secp256k1_gej *)&pubs[idx - 1].infinity);
                if (iVar4 != 0) {
                  return 0;
                }
                if (uStack_6b58 < local_6940 - 1) {
                  secp256k1_ge_set_gej_var
                            ((secp256k1_ge *)local_6bf0,(secp256k1_gej *)&pubs[idx - 1].infinity);
                  secp256k1_rangeproof_serialize_point
                            ((uchar *)&c.infinity,(secp256k1_ge *)local_6bf0);
                  cVar2 = (char)c.infinity;
                  secp256k1_sha256_write((secp256k1_sha256 *)local_58e0,(uchar *)&c.infinity,0x21);
                  *(byte *)(v + (uStack_6b58 >> 3)) =
                       *(byte *)(v + (uStack_6b58 >> 3)) | cVar2 << ((byte)uStack_6b58 & 7);
                  *(undefined8 *)((long)plen_local + i) = stack0xffffffffffff9469;
                  *(undefined8 *)((long)plen_local + i + 8) = tmpc._1_8_;
                  *(undefined8 *)((long)plen_local + i + 0x10) = tmpc._9_8_;
                  *(undefined8 *)((long)plen_local + i + 0x18) = tmpc._17_8_;
                  i = i + 0x20;
                }
                idx = secidx[uStack_6b58 + 0x1f] + idx;
              }
              secp256k1_rangeproof_pub_expand
                        ((secp256k1_gej *)(s[0x7f].d + 3),exp,secidx + 0x1f,local_6940,genp);
              if (extra_commit != (uchar *)0x0) {
                secp256k1_sha256_write((secp256k1_sha256 *)local_58e0,extra_commit,extra_commit_len)
                ;
              }
              secp256k1_sha256_finalize((secp256k1_sha256 *)local_58e0,(uchar *)&signs);
              iVar4 = secp256k1_borromean_sign
                                ((secp256k1_ecmult_gen_context *)proof_local,
                                 (uchar *)((long)plen_local + i),
                                 (secp256k1_scalar *)(sec[0x1f].d + 3),
                                 (secp256k1_gej *)(s[0x7f].d + 3),(secp256k1_scalar *)(stmp.d + 3),
                                 (secp256k1_scalar *)(k[0x1f].d + 3),secidx + 0x1f,&len,local_6940,
                                 (uchar *)&signs,0x20);
              if (iVar4 == 0) {
                ecmult_gen_ctx_local._4_4_ = 0;
              }
              else {
                for (uStack_6b58 = 0; i = i + 0x20, uStack_6b58 < idx; uStack_6b58 = uStack_6b58 + 1
                    ) {
                  secp256k1_scalar_get_b32
                            ((uchar *)((long)plen_local + i),
                             (secp256k1_scalar *)(sec[uStack_6b58 + 0x1f].d + 3));
                }
                *(size_t *)min_value_local = i;
                memset(local_68e8,0,0x1000);
                ecmult_gen_ctx_local._4_4_ = 1;
              }
            }
            else {
              ecmult_gen_ctx_local._4_4_ = 0;
            }
          }
        }
      }
      else {
        ecmult_gen_ctx_local._4_4_ = 0;
      }
    }
  }
  return ecmult_gen_ctx_local._4_4_;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_sign_impl(const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *proof, size_t *plen, uint64_t min_value,
 const secp256k1_ge *commit, const unsigned char *blind, const unsigned char *nonce, int exp, int min_bits, uint64_t value,
 const unsigned char *message, size_t msg_len, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp){
    secp256k1_gej pubs[128];     /* Candidate digits for our proof, most inferred. */
    secp256k1_scalar s[128];     /* Signatures in our proof, most forged. */
    secp256k1_scalar sec[32];    /* Blinding factors for the correct digits. */
    secp256k1_scalar k[32];      /* Nonces for our non-forged signatures. */
    secp256k1_scalar stmp;
    secp256k1_sha256 sha256_m;
    unsigned char prep[4096];
    unsigned char tmp[33];
    unsigned char *signs;          /* Location of sign flags in the proof. */
    uint64_t v;
    uint64_t scale;                /* scale = 10^exp. */
    int mantissa;                  /* Number of bits proven in the blinded value. */
    size_t rings;                     /* How many digits will our proof cover. */
    size_t rsizes[32];                /* How many possible values there are for each place. */
    size_t secidx[32];                /* Which digit is the correct one. */
    size_t len;                       /* Number of bytes used so far. */
    size_t i;
    int overflow;
    size_t npub;
    len = 0;
    if (*plen < 65 || min_value > value || min_bits > 64 || min_bits < 0 || exp < -1 || exp > 18) {
        return 0;
    }
    if (!secp256k1_range_proveparams(&v, &rings, rsizes, &npub, secidx, &min_value, &mantissa, &scale, &exp, &min_bits, value)) {
        return 0;
    }
    proof[len] = (rsizes[0] > 1 ? (64 | exp) : 0) | (min_value ? 32 : 0);
    len++;
    if (rsizes[0] > 1) {
        VERIFY_CHECK(mantissa > 0 && mantissa <= 64);
        proof[len] = mantissa - 1;
        len++;
    }
    if (min_value) {
        for (i = 0; i < 8; i++) {
            proof[len + i] = (min_value >> ((7-i) * 8)) & 255;
        }
        len += 8;
    }
    /* Do we have enough room in the proof for the message? Each ring gives us 128 bytes, but the
     * final ring is used to encode the blinding factor and the value, so we can't use that. (Well,
     * technically there are 64 bytes available if we avoided the other data, but this is difficult
     * because it's not always in the same place. */
    if (msg_len > 0 && msg_len > 128 * (rings - 1)) {
        return 0;
    }
    /* Do we have enough room for the proof? */
    if (*plen - len < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(tmp, commit);
    secp256k1_sha256_write(&sha256_m, tmp, 33);
    secp256k1_rangeproof_serialize_point(tmp, genp);
    secp256k1_sha256_write(&sha256_m, tmp, 33);
    secp256k1_sha256_write(&sha256_m, proof, len);

    memset(prep, 0, 4096);
    if (message != NULL) {
        memcpy(prep, message, msg_len);
    }
    /* Note, the data corresponding to the blinding factors must be zero. */
    if (rsizes[rings - 1] > 1) {
        size_t idx;
        /* Value encoding sidechannel. */
        idx = rsizes[rings - 1] - 1;
        idx -= secidx[rings - 1] == idx;
        idx = ((rings - 1) * 4 + idx) * 32;
        for (i = 0; i < 8; i++) {
            prep[8 + i + idx] = prep[16 + i + idx] = prep[24 + i + idx] = (v >> (56 - i * 8)) & 255;
            prep[i + idx] = 0;
        }
        prep[idx] = 128;
    }
    if (!secp256k1_rangeproof_genrand(sec, s, prep, rsizes, rings, nonce, commit, proof, len, genp)) {
        return 0;
    }
    memset(prep, 0, 4096);
    for (i = 0; i < rings; i++) {
        /* Sign will overwrite the non-forged signature, move that random value into the nonce. */
        k[i] = s[i * 4 + secidx[i]];
        secp256k1_scalar_clear(&s[i * 4 + secidx[i]]);
    }
    /** Genrand returns the last blinding factor as -sum(rest),
     *   adding in the blinding factor for our commitment, results in the blinding factor for
     *   the commitment to the last digit that the verifier can compute for itself by subtracting
     *   all the digits in the proof from the commitment. This lets the prover skip sending the
     *   blinded value for one digit.
     */
    secp256k1_scalar_set_b32(&stmp, blind, &overflow);
    secp256k1_scalar_add(&sec[rings - 1], &sec[rings - 1], &stmp);
    if (overflow || secp256k1_scalar_is_zero(&sec[rings - 1])) {
        return 0;
    }
    signs = &proof[len];
    /* We need one sign bit for each blinded value we send. */
    for (i = 0; i < (rings + 6) >> 3; i++) {
        signs[i] = 0;
        len++;
    }
    npub = 0;
    for (i = 0; i < rings; i++) {
        /*OPT: Use the precomputed gen2 basis?*/
        secp256k1_pedersen_ecmult(ecmult_gen_ctx, &pubs[npub], &sec[i], ((uint64_t)secidx[i] * scale) << (i*2), genp);
        if (secp256k1_gej_is_infinity(&pubs[npub])) {
            return 0;
        }
        if (i < rings - 1) {
            unsigned char tmpc[33];
            secp256k1_ge c;
            unsigned char quadness;
            /*OPT: split loop and batch invert.*/
            /*OPT: do not compute full pubs[npub] in ge form; we only need x */
            secp256k1_ge_set_gej_var(&c, &pubs[npub]);
            secp256k1_rangeproof_serialize_point(tmpc, &c);
            quadness = tmpc[0];
            secp256k1_sha256_write(&sha256_m, tmpc, 33);
            signs[i>>3] |= quadness << (i&7);
            memcpy(&proof[len], tmpc + 1, 32);
            len += 32;
        }
        npub += rsizes[i];
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, tmp);
    if (!secp256k1_borromean_sign(ecmult_gen_ctx, &proof[len], s, pubs, k, sec, rsizes, secidx, rings, tmp, 32)) {
        return 0;
    }
    len += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_get_b32(&proof[len],&s[i]);
        len += 32;
    }
    VERIFY_CHECK(len <= *plen);
    *plen = len;
    memset(prep, 0, 4096);
    return 1;
}